

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall Nova::Driver<float,_3>::Read_Last_Frame(Driver<float,_3> *this)

{
  pointer pcVar1;
  Example<float,_3> *pEVar2;
  bool bVar3;
  istream *this_00;
  string filename;
  string local_38;
  
  pcVar1 = (this->example->output_directory)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->example->output_directory)._M_string_length)
  ;
  std::__cxx11::string::append((char *)&local_38);
  bVar3 = File_Utilities::File_Exists(&local_38,true);
  if (bVar3) {
    pEVar2 = this->example;
    this_00 = File_Utilities::Safe_Open_Input(&local_38,false);
    std::istream::operator>>((istream *)this_00,&pEVar2->restart_frame);
    (**(code **)(*(long *)this_00 + 8))(this_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Driver<T,d>::
Read_Last_Frame()
{
    std::string filename=example.output_directory+"/common/last_frame";
    if(File_Utilities::File_Exists(filename))
        File_Utilities::Read_From_Text_File(filename,example.restart_frame);
}